

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall QDaemonThread::QDaemonThread(QDaemonThread *this,QObject *parent)

{
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Object *unaff_retaddr;
  offset_in_QThread_to_subr in_stack_00000020;
  Connection *in_stack_ffffffffffffffa0;
  QObject *in_stack_ffffffffffffffb8;
  QThread *in_stack_ffffffffffffffc0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffff0;
  ContextType *context;
  
  context = *(ContextType **)(in_FS_OFFSET + 0x28);
  QThread::QThread(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR_metaObject_00be86c8;
  QObject::
  connect<void(QThread::*)(QThread::QPrivateSignal),QDaemonThread::QDaemonThread(QObject*)::__0>
            (unaff_retaddr,in_stack_00000020,context,in_stack_fffffffffffffff0,
             (ConnectionType)parent);
  QMetaObject::Connection::~Connection(in_stack_ffffffffffffffa0);
  if (*(ContextType **)(in_FS_OFFSET + 0x28) == context) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDaemonThread::QDaemonThread(QObject *parent)
    : QThread(parent)
{
    // QThread::started() is emitted from the thread we start
    connect(this, &QThread::started,
            this,
            [](){ QThreadData::current()->requiresCoreApplication = false; },
            Qt::DirectConnection);
}